

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit.h
# Opt level: O2

string * __thiscall
re2c::replaceParam<std::__cxx11::string>
          (string *__return_storage_ptr__,re2c *this,string *str,string *param,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  string *psVar1;
  ulong uVar2;
  ostringstream strValue;
  string local_1c8 [32];
  ostringstream local_1a8 [376];
  
  if (str->_M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    std::operator<<((ostream *)local_1a8,(string *)param);
    while( true ) {
      uVar2 = std::__cxx11::string::find((string *)this,(ulong)str);
      if (uVar2 == 0xffffffffffffffff) break;
      psVar1 = (string *)str->_M_string_length;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace((ulong)this,uVar2,psVar1);
      std::__cxx11::string::~string(local_1c8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string replaceParam (std::string str, const std::string & param, const _Ty & value)
{
	if (!param.empty ())
	{
		std::ostringstream strValue;
		strValue << value;
		std::string::size_type pos;
		while((pos = str.find(param)) != std::string::npos)
		{
			str.replace(pos, param.length(), strValue.str());
		}
	}
	return str;
}